

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase154::run(TestCase154 *this)

{
  Reader reader;
  undefined1 auVar1 [32];
  Reader reader_00;
  long lVar2;
  undefined4 uVar3;
  PointerType PVar4;
  bool bVar5;
  Reader value;
  Builder root;
  MallocMessageBuilder builder;
  PointerReader local_1d8;
  Builder local_1b8;
  StructBuilder local_1a0;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined6 uStack_160;
  undefined2 uStack_15a;
  undefined6 uStack_158;
  ushort uStack_152;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined6 uStack_130;
  undefined2 uStack_12a;
  undefined6 uStack_128;
  ushort uStack_122;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  MallocMessageBuilder local_118;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_118,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_1b8,&local_118.super_MessageBuilder);
  local_1d8.pointer = local_1b8.builder.pointer;
  local_1d8.segment = &(local_1b8.builder.segment)->super_SegmentReader;
  local_1d8.capTable = &(local_1b8.builder.capTable)->super_CapTableReader;
  PointerBuilder::getStruct
            (&local_1a0,(PointerBuilder *)&local_1d8,(StructSize)0x140006,(word *)0x0);
  *(undefined4 *)((long)local_1a0.data + 0x14) = 0x7b;
  *(undefined8 *)((long)local_1a0.data + 0x28) = 0x3ff8000000000000;
  local_1d8.segment = &(local_1a0.segment)->super_SegmentReader;
  local_1d8.capTable = &(local_1a0.capTable)->super_CapTableReader;
  local_1d8.pointer = local_1a0.pointers;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1d8,value);
  bVar5 = true;
  if (0xbf < local_1a0.dataSize) {
    bVar5 = *(int *)((long)local_1a0.data + 0x14) != 0x7b;
  }
  if ((bVar5) && (kj::_::Debug::minSeverity < 3)) {
    uVar3 = 0;
    local_1d8.segment = (SegmentReader *)CONCAT44(local_1d8.segment._4_4_,0x7b);
    if (0xbf < local_1a0.dataSize) {
      uVar3 = *(undefined4 *)((long)local_1a0.data + 0x14);
    }
    local_1b8.builder.segment = (SegmentBuilder *)CONCAT44(local_1b8.builder.segment._4_4_,uVar3);
    kj::_::Debug::log<char_const(&)[50],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0xa3,ERROR,
               "\"failed: expected \" \"(123) == (copy.getUInt32Field())\", 123, copy.getUInt32Field()"
               ,(char (*) [50])"failed: expected (123) == (copy.getUInt32Field())",(int *)&local_1d8
               ,(uint *)&local_1b8);
  }
  bVar5 = true;
  if (0x17f < local_1a0.dataSize) {
    bVar5 = *(double *)((long)local_1a0.data + 0x28) != 1.5;
  }
  if ((bVar5) && (kj::_::Debug::minSeverity < 3)) {
    local_1d8.segment = (SegmentReader *)0x3ff8000000000000;
    local_1b8.builder.segment = (SegmentBuilder *)0x0;
    if (0x17f < local_1a0.dataSize) {
      local_1b8.builder.segment = *(SegmentBuilder **)((long)local_1a0.data + 0x28);
    }
    kj::_::Debug::log<char_const(&)[51],double,double>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0xa4,ERROR,
               "\"failed: expected \" \"(1.5) == (copy.getFloat64Field())\", 1.5, copy.getFloat64Field()"
               ,(char (*) [51])"failed: expected (1.5) == (copy.getFloat64Field())",
               (double *)&local_1d8,(double *)&local_1b8);
  }
  local_1d8.segment = (SegmentReader *)0x0;
  local_1d8.capTable = (CapTableReader *)0x0;
  local_1d8.pointer = (WirePointer *)0x0;
  local_1d8.nestingLimit = 0x7fffffff;
  PVar4 = PointerReader::getPointerType(&local_1d8);
  if ((PVar4 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0xa5,ERROR,"\"failed: expected \" \"!(copy.hasTextField())\"",
               (char (*) [40])"failed: expected !(copy.hasTextField())");
  }
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  uStack_12a = 0;
  uStack_128 = 0;
  uStack_120 = 0x7fffffff;
  lVar2 = (ulong)uStack_122 << 0x30;
  reader._reader._44_4_ = uStack_11c;
  reader._reader.nestingLimit = 0x7fffffff;
  auVar1 = ZEXT1632(ZEXT816(0));
  reader._reader.dataSize = (int)lVar2;
  reader._reader.pointerCount = (short)((ulong)lVar2 >> 0x20);
  reader._reader._38_2_ = (short)((ulong)lVar2 >> 0x30);
  reader._reader.segment = (SegmentReader *)auVar1._0_8_;
  reader._reader.capTable = (CapTableReader *)auVar1._8_8_;
  reader._reader.data = (void *)auVar1._16_8_;
  reader._reader.pointers = (WirePointer *)auVar1._24_8_;
  checkTestMessageAllZero(reader);
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  uStack_15a = 0;
  uStack_158 = 0;
  uStack_150 = 0x7fffffff;
  lVar2 = (ulong)uStack_152 << 0x30;
  reader_00._reader._44_4_ = uStack_14c;
  reader_00._reader.nestingLimit = 0x7fffffff;
  auVar1 = ZEXT1632(ZEXT816(0));
  reader_00._reader.dataSize = (int)lVar2;
  reader_00._reader.pointerCount = (short)((ulong)lVar2 >> 0x20);
  reader_00._reader._38_2_ = (short)((ulong)lVar2 >> 0x30);
  reader_00._reader.segment = (SegmentReader *)auVar1._0_8_;
  reader_00._reader.capTable = (CapTableReader *)auVar1._8_8_;
  reader_00._reader.data = (void *)auVar1._16_8_;
  reader_00._reader.pointers = (WirePointer *)auVar1._24_8_;
  checkTestMessageAllZero(reader_00);
  MallocMessageBuilder::~MallocMessageBuilder(&local_118);
  return;
}

Assistant:

TEST(Message, ReadWriteDataStruct) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<TestAllTypes>();

  root.setUInt32Field(123);
  root.setFloat64Field(1.5);
  root.setTextField("foo");

  auto copy = readDataStruct<TestAllTypes>(writeDataStruct(root));
  EXPECT_EQ(123, copy.getUInt32Field());
  EXPECT_EQ(1.5, copy.getFloat64Field());
  EXPECT_FALSE(copy.hasTextField());

  checkTestMessageAllZero(readDataStruct<TestAllTypes>(nullptr));
  checkTestMessageAllZero(defaultValue<TestAllTypes>());
}